

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast6.c
# Opt level: O1

word Extra_Truth6MinimumRoundOne(word t,int iVar,char *pCanonPerm,uint *pCanonPhase)

{
  long lVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  word wVar5;
  ulong uVar6;
  word t_00;
  word wVar7;
  word t_01;
  word wVar8;
  word t_02;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  word wVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  
  if (4 < (uint)iVar) {
    __assert_fail("iVar >= 0 && iVar < 5",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/lucky/luckyFast6.c"
                  ,0x69,"word Extra_Truth6MinimumRoundOne(word, int, char *, unsigned int *)");
  }
  wVar5 = Extra_Truth6ChangePhase(t,iVar);
  wVar12 = t;
  if (wVar5 < t) {
    wVar12 = wVar5;
  }
  uVar6 = (ulong)(uint)iVar;
  lVar1 = uVar6 + 1;
  t_00 = Extra_Truth6ChangePhase(t,(int)lVar1);
  uVar13 = wVar12;
  if (t_00 < wVar12) {
    uVar13 = t_00;
  }
  wVar7 = Extra_Truth6ChangePhase(t_00,iVar);
  uVar14 = uVar13;
  if (wVar7 < uVar13) {
    uVar14 = wVar7;
  }
  t_01 = Extra_Truth6SwapAdjacent(t,iVar);
  uVar11 = uVar14;
  if (t_01 < uVar14) {
    uVar11 = t_01;
  }
  wVar8 = Extra_Truth6ChangePhase(t_01,iVar);
  uVar15 = uVar11;
  if (wVar8 < uVar11) {
    uVar15 = wVar8;
  }
  t_02 = Extra_Truth6ChangePhase(t_01,(int)lVar1);
  uVar9 = uVar15;
  if (t_02 < uVar15) {
    uVar9 = t_02;
  }
  uVar10 = Extra_Truth6ChangePhase(t_02,iVar);
  if (uVar10 < uVar9) {
    uVar4 = *pCanonPhase;
    uVar3 = 3 << ((byte)iVar & 0x1f) ^ uVar4;
    cVar2 = pCanonPerm[uVar6];
    pCanonPerm[uVar6] = pCanonPerm[lVar1];
    pCanonPerm[lVar1] = cVar2;
    if (((uVar3 >> ((byte)lVar1 & 0x1f) ^ uVar3 >> ((byte)iVar & 0x1f)) & 1) != 0) {
      uVar3 = uVar4;
    }
  }
  else {
    uVar3 = 2;
    if (wVar12 <= t_00) {
      uVar3 = (uint)(wVar5 < t);
    }
    uVar4 = 3;
    if (uVar13 <= wVar7) {
      uVar4 = uVar3;
    }
    uVar3 = 4;
    if (uVar14 <= t_01) {
      uVar3 = uVar4;
    }
    uVar4 = 6;
    if (uVar11 <= wVar8) {
      uVar4 = uVar3;
    }
    uVar3 = 5;
    if (uVar15 <= t_02) {
      uVar3 = uVar4;
    }
    uVar3 = adjustInfoAfterSwap(pCanonPerm,*pCanonPhase,iVar,uVar3);
    uVar10 = uVar9;
  }
  *pCanonPhase = uVar3;
  return uVar10;
}

Assistant:

word Extra_Truth6MinimumRoundOne( word t, int iVar, char* pCanonPerm, unsigned* pCanonPhase )
{
    word tCur, tMin = t; // ab 
    unsigned info =0;
    assert( iVar >= 0 && iVar < 5 );
    
    tCur = Extra_Truth6ChangePhase( t, iVar );    // !a b
    if(tCur<tMin)
    {
        info = 1;
        tMin = tCur;
    }
    tCur = Extra_Truth6ChangePhase( t, iVar+1 );  // a !b
    if(tCur<tMin)
    {
        info = 2;
        tMin = tCur;
    }
    tCur = Extra_Truth6ChangePhase( tCur, iVar ); // !a !b
    if(tCur<tMin)
    {
        info = 3;
        tMin = tCur;
    }
    
    t    = Extra_Truth6SwapAdjacent( t, iVar );   // b a
    if(t<tMin)
    {
        info = 4;
        tMin = t;
    }
    
    tCur = Extra_Truth6ChangePhase( t, iVar );    // !b a
    if(tCur<tMin)
    {
        info = 6;
        tMin = tCur;
    }
    tCur = Extra_Truth6ChangePhase( t, iVar+1 );  // b !a
    if(tCur<tMin)
    {
        info = 5;
        tMin = tCur;
    }
    tCur = Extra_Truth6ChangePhase( tCur, iVar ); // !b !a
    if(tCur<tMin)
    {
        (* pCanonPhase) = adjustInfoAfterSwap(pCanonPerm, * pCanonPhase, iVar, 7);
        return tCur;
    }
    else
    {
        (* pCanonPhase) = adjustInfoAfterSwap(pCanonPerm, * pCanonPhase, iVar, info);
        return tMin;
    }
}